

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_ComputeSumReduction(leb_Heap *leb)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  byte bVar6;
  uint32_t tmp1;
  uint uVar7;
  uint uVar8;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  leb_Node node_03;
  leb_Node node_04;
  uint32_t nodeID;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  long local_68;
  
  iVar1 = leb->maxDepth;
  uVar7 = 2 << ((byte)iVar1 & 0x1f);
  uVar2 = iVar1 - 5;
  local_68 = (ulong)uVar2 << 0x20;
  uVar9 = 1 << ((byte)iVar1 & 0x1f);
  for (uVar10 = uVar9; uVar10 < uVar7; uVar10 = uVar10 + 0x20) {
    uVar3 = ((leb->maxDepth - iVar1) + 1) * uVar10 + uVar7;
    uVar8 = leb->buffer[uVar3 >> 5];
    uVar8 = (uVar8 >> 1 & 0x55555555) + (uVar8 & 0x55555555);
    leb->buffer[uVar3 - uVar9 >> 5] = uVar8;
    uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
    node.id = uVar10 >> 2;
    node.depth = iVar1 + -2;
    leb__HeapWriteExplicit
              (leb,node,0x18,
               uVar8 >> 7 & 0xe00000 |
               uVar8 >> 6 & 0x1c0000 |
               uVar8 >> 5 & 0x38000 |
               uVar8 >> 4 & 0x7000 |
               uVar8 >> 3 & 0xe00 | uVar8 >> 2 & 0x1c0 | uVar8 >> 1 & 0x38 | uVar8 & 7);
    uVar8 = (uVar8 >> 4 & 0x7070707) + (uVar8 & 0x7070707);
    node_00.id = uVar10 >> 3;
    node_00.depth = iVar1 + -3;
    leb__HeapWriteExplicit
              (leb,node_00,0x10,
               uVar8 >> 0xc & 0xf000 | uVar8 >> 8 & 0xf00 | (uVar8 >> 4 | uVar8) & 0xff);
    uVar8 = (uVar8 >> 8 & 0xf000f) + (uVar8 & 0xf000f);
    node_01.id = uVar10 >> 4;
    node_01.depth = iVar1 + -4;
    leb__HeapWriteExplicit(leb,node_01,10,uVar8 >> 0xb | uVar8 & 0xff);
    node_02.id = uVar10 >> 5;
    node_02.depth = uVar2;
    leb__HeapWriteExplicit(leb,node_02,6,(uVar8 >> 0x10) + (uVar8 & 0xff));
  }
  while (uVar10 = uVar2, local_68 = local_68 + -0x100000000, 0 < (int)uVar10) {
    bVar6 = (byte)(uVar10 - 1);
    uVar2 = 1 << (bVar6 & 0x1f);
    uVar11 = uVar2 * 2;
    for (uVar12 = (ulong)uVar2; uVar2 = uVar10 - 1, uVar12 < (uint)(2 << (bVar6 & 0x1f));
        uVar12 = uVar12 + 1) {
      node_03.depth = uVar10;
      node_03.id = uVar11;
      uVar4 = leb__HeapRead(leb,node_03);
      node_04.depth = uVar10;
      node_04.id = uVar11 + 1;
      uVar5 = leb__HeapRead(leb,node_04);
      leb__HeapWriteExplicit
                (leb,(leb_Node)(local_68 + uVar12),(leb->maxDepth - uVar10) + 2,uVar4 + uVar5);
      uVar11 = uVar11 + 2;
    }
  }
  return;
}

Assistant:

LEBDEF void leb_ComputeSumReduction(leb_Heap *leb)
{
    int depth = leb->maxDepth;
    uint32_t minNodeID = (1u << depth);
    uint32_t maxNodeID = (2u << depth);

    // prepass: processes deepest levels in parallel
    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; nodeID+= 32u) {
        uint32_t alignedBitOffset = leb__NodeBitID(leb, {nodeID, depth});
        uint32_t bitField = leb->buffer[alignedBitOffset >> 5u];
        uint32_t bitData = 0u;

        // 2-bits
        bitField = (bitField & 0x55555555u) + ((bitField >> 1u) & 0x55555555u);
        bitData = bitField;
        leb->buffer[(alignedBitOffset - minNodeID) >> 5u] = bitData;

        // 3-bits
        bitField = (bitField & 0x33333333u) + ((bitField >>  2u) & 0x33333333u);
        bitData = ((bitField >> 0u) & (7u <<  0u))
                | ((bitField >> 1u) & (7u <<  3u))
                | ((bitField >> 2u) & (7u <<  6u))
                | ((bitField >> 3u) & (7u <<  9u))
                | ((bitField >> 4u) & (7u << 12u))
                | ((bitField >> 5u) & (7u << 15u))
                | ((bitField >> 6u) & (7u << 18u))
                | ((bitField >> 7u) & (7u << 21u));
        leb__HeapWriteExplicit(leb, {nodeID >> 2u, depth - 2}, 24u, bitData);

        // 4-bits
        bitField = (bitField & 0x0F0F0F0Fu) + ((bitField >>  4u) & 0x0F0F0F0Fu);
        bitData = ((bitField >>  0u) & (15u <<  0u))
                | ((bitField >>  4u) & (15u <<  4u))
                | ((bitField >>  8u) & (15u <<  8u))
                | ((bitField >> 12u) & (15u << 12u));
        leb__HeapWriteExplicit(leb, {nodeID >> 3u, depth - 3}, 16u, bitData);

        // 5-bits
        bitField = (bitField & 0x00FF00FFu) + ((bitField >>  8u) & 0x00FF00FFu);
        bitData = ((bitField >>  0u) & (31u << 0u))
                | ((bitField >> 11u) & (31u << 5u));
        leb__HeapWriteExplicit(leb, {nodeID >> 4u, depth - 4}, 10u, bitData);

        // 6-bits
        bitField = (bitField & 0x0000FFFFu) + ((bitField >> 16u) & 0x0000FFFFu);
        bitData = bitField;
        leb__HeapWriteExplicit(leb, {nodeID >> 5u, depth - 5},  6u, bitData);
    }
    depth-= 5;

    // iterate over elements atomically
    while (--depth >= 0) {
        uint32_t minNodeID = 1u << depth;
        uint32_t maxNodeID = 2u << depth;

        for (uint32_t j = minNodeID; j < maxNodeID; ++j) {
            uint32_t x0 = leb__HeapRead(leb, {j << 1u     , depth + 1});
            uint32_t x1 = leb__HeapRead(leb, {j << 1u | 1u, depth + 1});

            leb__HeapWrite(leb, {j, depth}, x0 + x1);
        }
    }
}